

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::ApplyS<unsigned_char,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  byte *pbVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  iVar5 = k->v1;
  if (iVar5 != k->v2) {
    fVar1 = k->A;
    do {
      iVar3 = k->rowlen - iVar5;
      iVar2 = iVar3 - k->w2;
      if (iVar2 < k->u1) {
        iVar2 = k->u1;
      }
      iVar3 = iVar3 - k->w1;
      if (k->u2 < iVar3) {
        iVar3 = k->u2;
      }
      iVar3 = (iVar3 - iVar2) * nTxChan;
      if (0 < iVar3) {
        pbVar6 = (byte *)((long)((k->rowlen * iVar5 + iVar2) * nTxChan) + (long)data);
        pbVar4 = pbVar6 + iVar3;
        fVar8 = (float)iVar2 - k->u;
        fVar7 = (float)iVar5 - k->v;
        fVar9 = fVar8 * k->A * fVar8 + (k->B * fVar8 + k->C * fVar7) * fVar7;
        fVar7 = (fVar8 + fVar8 + 1.0) * k->A + fVar7 * k->B;
        do {
          if (fVar9 < 1.0) {
            fVar8 = expf(fVar9 * -6.125);
            fVar8 = fVar8 * k->wscale;
            k->weight = k->weight + fVar8;
            *result = (float)*pbVar6 * fVar8 + *result;
            result[1] = (float)pbVar6[1] * fVar8 + result[1];
            result[2] = (float)pbVar6[2] * fVar8 + result[2];
            result[3] = (float)pbVar6[3] * fVar8 + result[3];
          }
          fVar9 = fVar9 + fVar7;
          fVar7 = fVar7 + fVar1 + fVar1;
          pbVar6 = pbVar6 + nTxChan;
        } while (pbVar6 < pbVar4);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != k->v2);
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }